

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O3

long _computeIntegerOperation<long,long>(TokenType type,long x,long y)

{
  long lVar1;
  undefined6 in_register_0000003a;
  string local_30;
  
  switch((int)CONCAT62(in_register_0000003a,type)) {
  case 0x4e:
    lVar1 = y + x;
    break;
  case 0x4f:
    lVar1 = x - y;
    break;
  case 0x50:
    lVar1 = x % y;
    break;
  case 0x51:
    lVar1 = y * x;
    break;
  case 0x52:
    lVar1 = x / y;
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown operation","");
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x9e,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    lVar1 = 0;
  }
  return lVar1;
}

Assistant:

static R _computeIntegerOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
  case TokenType::TOK_OP_MOD:
		return static_cast<R>(x % y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}